

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tle.cc
# Opt level: O2

void __thiscall libsgp4::Tle::ExtractDouble(Tle *this,string *str,int point_pos,double *val)

{
  char cVar1;
  bool bVar2;
  char *pcVar3;
  TleException *pTVar4;
  char cVar5;
  char *pcVar6;
  string temp;
  
  temp._M_dataplus._M_p = (pointer)&temp.field_2;
  temp._M_string_length = 0;
  temp.field_2._M_local_buf[0] = '\0';
  pcVar3 = (str->_M_dataplus)._M_p;
  bVar2 = false;
  pcVar6 = pcVar3;
  do {
    if (pcVar6 == pcVar3 + str->_M_string_length) {
      bVar2 = Util::FromString<double>(&temp,val);
      if (bVar2) {
        std::__cxx11::string::~string((string *)&temp);
        return;
      }
      pTVar4 = (TleException *)__cxa_allocate_exception(0x10);
      TleException::TleException(pTVar4,"Failed to convert value to double");
      __cxa_throw(pTVar4,&TleException::typeinfo,std::runtime_error::~runtime_error);
    }
    cVar5 = (char)&temp;
    if (point_pos < 0) {
      if (pcVar6 == pcVar3 && point_pos == -1) {
        std::__cxx11::string::push_back(cVar5);
        std::__cxx11::string::push_back(cVar5);
      }
LAB_00108243:
      if (9 < (int)*pcVar6 - 0x30U) {
        pTVar4 = (TleException *)__cxa_allocate_exception(0x10);
        TleException::TleException(pTVar4,"Invalid digit");
LAB_00108305:
        __cxa_throw(pTVar4,&TleException::typeinfo,std::runtime_error::~runtime_error);
      }
LAB_00108256:
      std::__cxx11::string::push_back(cVar5);
    }
    else {
      if (pcVar3 + ((ulong)(uint)point_pos - 1) <= pcVar6) {
        if (pcVar6 != pcVar3 + ((ulong)(uint)point_pos - 1)) goto LAB_00108243;
        if (temp._M_string_length == 0) {
          std::__cxx11::string::push_back(cVar5);
        }
        if (*pcVar6 != '.') {
          pTVar4 = (TleException *)__cxa_allocate_exception(0x10);
          TleException::TleException(pTVar4,"Failed to find decimal point");
          goto LAB_00108305;
        }
        goto LAB_00108256;
      }
      cVar1 = *pcVar6;
      if ((pcVar6 == pcVar3) && ((cVar1 == '-' || (cVar1 == '+')))) {
        std::__cxx11::string::push_back(cVar5);
      }
      else if ((int)cVar1 - 0x30U < 10) {
        bVar2 = true;
        std::__cxx11::string::push_back(cVar5);
      }
      else {
        if (bVar2) {
          pTVar4 = (TleException *)__cxa_allocate_exception(0x10);
          TleException::TleException(pTVar4,"Unexpected non digit");
LAB_0010836d:
          __cxa_throw(pTVar4,&TleException::typeinfo,std::runtime_error::~runtime_error);
        }
        if (cVar1 != ' ') {
          pTVar4 = (TleException *)__cxa_allocate_exception(0x10);
          TleException::TleException(pTVar4,"Invalid character");
          goto LAB_0010836d;
        }
        bVar2 = false;
      }
    }
    pcVar6 = pcVar6 + 1;
    pcVar3 = (str->_M_dataplus)._M_p;
  } while( true );
}

Assistant:

void Tle::ExtractDouble(const std::string& str, int point_pos, double& val)
{
    std::string temp;
    bool found_digit = false;

    for (std::string::const_iterator i = str.begin(); i != str.end(); ++i)
    {
        /*
         * integer part
         */
        if (point_pos >= 0 && i < str.begin() + point_pos - 1)
        {
            bool done = false;

            if (i == str.begin())
            {
                if(*i == '-' || *i == '+')
                {
                    /*
                     * first character could be signed
                     */
                    temp += *i;
                    done = true;
                }
            }

            if (!done)
            {
                if (isdigit(*i))
                {
                    found_digit = true;
                    temp += *i;
                }
                else if (found_digit)
                {
                    throw TleException("Unexpected non digit");
                }
                else if (*i != ' ')
                {
                    throw TleException("Invalid character");
                }
            }
        }
        /*
         * decimal point
         */
        else if (point_pos >= 0 && i == str.begin() + point_pos - 1)
        {
            if (temp.length() == 0)
            {
                /*
                 * integer part is blank, so add a '0'
                 */
                temp += '0';
            }

            if (*i == '.')
            {
                /*
                 * decimal point found
                 */
                temp += *i;
            }
            else
            {
                throw TleException("Failed to find decimal point");
            }
        }
        /*
         * fraction part
         */
        else
        {
            if (i == str.begin() && point_pos == -1)
            {
                /*
                 * no decimal point expected, add 0. beginning
                 */
                temp += '0';
                temp += '.';
            }
            
            /*
             * should be a digit
             */
            if (isdigit(*i))
            {
                temp += *i;
            }
            else
            {
                throw TleException("Invalid digit");
            }
        }
    }

    if (!Util::FromString<double>(temp, val))
    {
        throw TleException("Failed to convert value to double");
    }
}